

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_consumer_unittest.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::TestLineCollector::ConsumeLine
          (TestLineCollector *this,string_view line,string *out_error)

{
  string *psVar1;
  bool bVar2;
  AlphaNum *in_R8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  string local_d0;
  AlphaNum local_b0;
  AlphaNum local_80;
  string_view local_50 [3];
  
  local_e0._M_str = line._M_str;
  local_e0._M_len = line._M_len;
  psVar1 = this->reject_;
  if ((psVar1 != (string *)0x0) &&
     (__x._M_str = (psVar1->_M_dataplus)._M_p, __x._M_len = psVar1->_M_string_length,
     bVar2 = std::operator==(__x,line), bVar2)) {
    if (this->skip_msg_ == false) {
      local_50[0] = absl::lts_20250127::NullSafeStringView("Rejected \'");
      local_80.piece_._M_str = (this->reject_->_M_dataplus)._M_p;
      local_80.piece_._M_len = this->reject_->_M_string_length;
      local_b0.piece_ = absl::lts_20250127::NullSafeStringView("\'");
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_d0,(lts_20250127 *)local_50,&local_80,&local_b0,in_R8);
      std::__cxx11::string::operator=((string *)out_error,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    return false;
  }
  if ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this->lines_ !=
      (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this->lines_,
               &local_e0);
  }
  return true;
}

Assistant:

bool ConsumeLine(absl::string_view line, std::string* out_error) override {
    if (reject_ && *reject_ == line) {
      if (!skip_msg_) {
        *out_error = absl::StrCat("Rejected '", *reject_, "'");
      }
      return false;
    }
    if (lines_) {
      lines_->emplace_back(line);
    }
    return true;
  }